

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::console::console_func>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  console_func *pDst;
  console_func *pSrc_end;
  console_func *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  pDst = (console_func *)pDst_void;
  for (pSrc = (console_func *)pSrc_void;
      pSrc != (console_func *)((long)pSrc_void + (ulong)num * 0x10); pSrc = pSrc + 1) {
    pDst->m_func = pSrc->m_func;
    pDst->m_pData = pSrc->m_pData;
    pDst = pDst + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }